

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

uint32_t __thiscall Function_Pool::OutputInfo::getSum(OutputInfo *this)

{
  bool bVar1;
  undefined8 uVar2;
  reference puVar3;
  const_iterator value;
  uint32_t total;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffffc0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  undefined4 in_stack_ffffffffffffffe8;
  uint32_t uVar4;
  undefined4 in_stack_ffffffffffffffec;
  imageException *in_stack_fffffffffffffff0;
  
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(in_stack_ffffffffffffffd0)
  ;
  if (!bVar1) {
    uVar4 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              (in_stack_ffffffffffffffc0,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_ffffffffffffffb8);
    while( true ) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffffb8);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffffc0,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_ffffffffffffffb8);
      if (!bVar1) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_20);
      uVar4 = *puVar3 + uVar4;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_20);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x14c42a);
    return uVar4;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  imageException::imageException
            (in_stack_fffffffffffffff0,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  __cxa_throw(uVar2,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

uint32_t getSum()
        {
            if( sum.empty() )
                throw imageException( "Output array is empty" );

            uint32_t total = 0;

            for( std::vector < uint32_t >::const_iterator value = sum.begin(); value != sum.end(); ++value )
                total += *value;

            sum.clear(); // to guarantee that no one can use it second time

            return total;
        }